

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
n_pca::NPca::getLabelMap
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,NPca *this,string *label_path)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  istream *piVar5;
  reference pvVar6;
  char *__nptr;
  mapped_type *this_00;
  int local_27c;
  undefined1 local_278 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string input_str;
  istream local_240 [8];
  ifstream file;
  string *label_path_local;
  NPca *this_local;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *label_map;
  
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0) {
    printf("couldn\'t find label_path\n");
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_240,uVar4,8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      uVar4 = std::__cxx11::string::c_str();
      printf("couldn\'t open label_path: %s\n",uVar4);
    }
    else {
      std::__cxx11::string::string
                ((string *)
                 &tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_240,
                            (string *)
                            &tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar2) break;
        NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_278,this->n_config_,
                         (string *)
                         &tokens.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,':');
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_278,1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_278,0);
        __nptr = (char *)std::__cxx11::string::c_str();
        local_27c = atoi(__nptr);
        this_00 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](__return_storage_ptr__,&local_27c);
        std::__cxx11::string::operator=((string *)this_00,(string *)pvVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_278);
      }
      std::__cxx11::string::~string
                ((string *)
                 &tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::ifstream::~ifstream(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, string> NPca::getLabelMap(const string label_path)
{
    map<int, string> label_map;

    if (label_path.length() <= 0)
    {
        printf("couldn't find label_path\n");
        return label_map;
    }

    ifstream file(label_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open label_path: %s\n", label_path.c_str());
        return label_map;
    }

    string input_str;
    while (getline(file, input_str))
    {
        vector<string> tokens = n_config_->n_split(input_str, ':');
        label_map[atoi(tokens[0].c_str())] = tokens[1];
    }

    return label_map;
}